

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsave.cpp
# Opt level: O2

int CVmSaveFile::restore_get_image(osfildef *fp,char *fname_buf,size_t fname_buf_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ulong __size;
  char buf [128];
  
  sVar4 = fread(buf,0x31,1,(FILE *)fp);
  iVar1 = 0x65;
  iVar3 = iVar1;
  if (sVar4 == 1) {
    iVar2 = bcmp(buf,"T3-state-v000A\r\n\x1a",0x11);
    iVar3 = 0x4b1;
    if ((((iVar2 == 0) && (sVar4 = fread(buf,2,1,(FILE *)fp), iVar3 = iVar1, sVar4 == 1)) &&
        (__size = (ulong)(ushort)buf._0_2_, __size < fname_buf_len)) &&
       (sVar4 = fread(fname_buf,__size,1,(FILE *)fp), sVar4 == 1)) {
      fname_buf[__size] = '\0';
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int CVmSaveFile::restore_get_image(osfildef *fp,
                                   char *fname_buf, size_t fname_buf_len)
{
    /* read the signature, size/checksum, and timestamp fields */
    char buf[128];
    if (osfrb(fp, buf, sizeof(VMSAVEFILE_SIG)-1 + 8 + 24))
        return VMERR_READ_FILE;

    /* check the signature */
    if (memcmp(buf, VMSAVEFILE_SIG, sizeof(VMSAVEFILE_SIG)-1) != 0)
        return VMERR_NOT_SAVED_STATE;

    /* read the length of the image file name */
    if (osfrb(fp, buf, 2))
        return VMERR_READ_FILE;

    /* get the length from the buffer */
    size_t len = osrp2(buf);

    /* if it won't fit in the buffer, return an error */
    if (len + 1 > fname_buf_len)
        return VMERR_READ_FILE;

    /* read the name into the caller's buffer */
    if (osfrb(fp, fname_buf, len))
        return VMERR_READ_FILE;

    /* null-terminate the name */
    fname_buf[len] = '\0';

    /* success */
    return 0;
}